

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O3

int idaLsInitialize(IDAMem IDA_mem)

{
  void *pvVar1;
  int iVar2;
  IDAMem pIVar3;
  
  pvVar1 = IDA_mem->ida_lmem;
  if (pvVar1 == (void *)0x0) {
    IDAProcessError(IDA_mem,-2,0x4f4,"idaLsInitialize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                    ,"Linear solver memory is NULL.");
    return -2;
  }
  if (*(long *)((long)pvVar1 + 0x28) == 0) {
    *(undefined4 *)((long)pvVar1 + 8) = 0;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  }
  else if (*(int *)((long)pvVar1 + 8) == 0) {
    *(void **)((long)pvVar1 + 0x18) = IDA_mem->ida_user_data;
  }
  else {
    if ((**(long **)(*(long *)((long)pvVar1 + 0x28) + 8) == 0) ||
       ((iVar2 = SUNMatGetID(), iVar2 != 0 &&
        (iVar2 = SUNMatGetID(*(undefined8 *)((long)pvVar1 + 0x28)), iVar2 != 3)))) {
      IDAProcessError(IDA_mem,-3,0x515,"idaLsInitialize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                      ,"No Jacobian constructor available for SUNMatrix type");
      *(undefined4 *)((long)pvVar1 + 0xf8) = 0xfffffffd;
      return -3;
    }
    *(code **)((long)pvVar1 + 0x10) = idaLsDQJac;
    *(IDAMem *)((long)pvVar1 + 0x18) = IDA_mem;
  }
  *(undefined8 *)((long)pvVar1 + 0xb0) = 0;
  *(undefined8 *)((long)pvVar1 + 0xb8) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa8) = 0;
  *(undefined8 *)((long)pvVar1 + 0x90) = 0;
  *(undefined8 *)((long)pvVar1 + 0x98) = 0;
  *(undefined8 *)((long)pvVar1 + 0x80) = 0;
  *(undefined8 *)((long)pvVar1 + 0x88) = 0;
  if (*(int *)((long)pvVar1 + 0x120) == 0) {
    pIVar3 = (IDAMem)IDA_mem->ida_user_data;
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x128) = 0;
    *(code **)((long)pvVar1 + 0x130) = idaLsDQJtimes;
    pIVar3 = IDA_mem;
  }
  *(IDAMem *)((long)pvVar1 + 0x140) = pIVar3;
  if ((*(long *)((long)pvVar1 + 0x28) == 0) && (*(long *)((long)pvVar1 + 0x100) == 0)) {
    IDA_mem->ida_lsetup =
         (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0;
  }
  iVar2 = SUNLinSolGetType(*(undefined8 *)((long)pvVar1 + 0x20));
  if (iVar2 == 3) {
    IDA_mem->ida_lsetup =
         (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0;
    *(undefined4 *)((long)pvVar1 + 0x60) = 0;
  }
  iVar2 = SUNLinSolInitialize(*(undefined8 *)((long)pvVar1 + 0x20));
  *(int *)((long)pvVar1 + 0xf8) = iVar2;
  return iVar2;
}

Assistant:

int idaLsInitialize(IDAMem IDA_mem)
{
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Test for valid combinations of matrix & Jacobian routines: */
  if (idals_mem->J == NULL)
  {
    /* If SUNMatrix A is NULL: ensure 'jac' function pointer is NULL */
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = NULL;
    idals_mem->J_data = NULL;
  }
  else if (idals_mem->jacDQ)
  {
    /* If J is non-NULL, and 'jac' is not user-supplied:
       - if J is dense or band, ensure that our DQ approx. is used
       - otherwise => error */
    retval = 0;
    if (idals_mem->J->ops->getid)
    {
      if ((SUNMatGetID(idals_mem->J) == SUNMATRIX_DENSE) ||
          (SUNMatGetID(idals_mem->J) == SUNMATRIX_BAND))
      {
        idals_mem->jac    = idaLsDQJac;
        idals_mem->J_data = IDA_mem;
      }
      else { retval++; }
    }
    else { retval++; }
    if (retval)
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No Jacobian constructor available for SUNMatrix type");
      idals_mem->last_flag = IDALS_ILL_INPUT;
      return (IDALS_ILL_INPUT);
    }
  }
  else
  {
    /* If J is non-NULL, and 'jac' is user-supplied,
       reset J_data pointer (just in case) */
    idals_mem->J_data = IDA_mem->ida_user_data;
  }

  /* reset counters */
  idaLsInitializeCounters(idals_mem);

  /* Set Jacobian-related fields, based on jtimesDQ */
  if (idals_mem->jtimesDQ)
  {
    idals_mem->jtsetup = NULL;
    idals_mem->jtimes  = idaLsDQJtimes;
    idals_mem->jt_data = IDA_mem;
  }
  else { idals_mem->jt_data = IDA_mem->ida_user_data; }

  /* if J is NULL and psetup is not present, then idaLsSetup does
     not need to be called, so set the lsetup function to NULL */
  if ((idals_mem->J == NULL) && (idals_mem->pset == NULL))
  {
    IDA_mem->ida_lsetup = NULL;
  }

  /* When using a matrix-embedded linear solver disable lsetup call */
  if (SUNLinSolGetType(idals_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    IDA_mem->ida_lsetup = NULL;
    idals_mem->scalesol = SUNFALSE;
  }

  /* Call LS initialize routine */
  idals_mem->last_flag = SUNLinSolInitialize(idals_mem->LS);
  return (idals_mem->last_flag);
}